

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

piga_status piga_host_free(piga_host *host)

{
  piga_host *host_local;
  
  if (((undefined1  [24])((undefined1  [24])*host->config & (undefined1  [24])0x1) !=
       (undefined1  [24])0x0) && ((host->shared_memory).start != (void *)0x0)) {
    shmdt((host->shared_memory).start);
  }
  piga_shared_memory_free_players(&host->shared_memory);
  if (((undefined1  [24])((undefined1  [24])*host->config & (undefined1  [24])0x1) !=
       (undefined1  [24])0x0) && (host->shared_memory_id != 0)) {
    shmctl(host->shared_memory_id,0,(shmid_ds *)0x0);
  }
  if (host->host_queue != (piga_event_queue *)0x0) {
    piga_event_queue_free_in_shm(host->host_queue,host->host_queue_shm_id);
    host->host_queue = (piga_event_queue *)0x0;
    host->host_queue_shm_id = 0;
  }
  if (host->config != (piga_host_config *)0x0) {
    free(host->config);
  }
  piga_event_free(host->cache_event);
  free(host);
  return PIGA_STATUS_OK;
}

Assistant:

piga_status piga_host_free(piga_host *host)
{
    // Cleanup
    if(host->config->create_shared_memory && host->shared_memory.start) 
        shmdt(host->shared_memory.start);
    
    // Remove the shared memory.
    piga_shared_memory_free_players(&host->shared_memory);
    
    if(host->config->create_shared_memory && host->shared_memory_id)
        shmctl(host->shared_memory_id, IPC_RMID, NULL);
    
    // Free the host-queue, if it has been created.
    if(host->host_queue) {
        piga_event_queue_free_in_shm(host->host_queue, host->host_queue_shm_id);
        host->host_queue = 0;
        host->host_queue_shm_id = 0;
    }
    
    if(host->config) 
        free(host->config);
    
    piga_event_free(host->cache_event);
    
    free(host);
    
    return PIGA_STATUS_OK;
}